

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O0

void __thiscall sparse_tree::sparse_tree(sparse_tree *this,string *structure,int n)

{
  size_type __new_size;
  int in_EDX;
  string *in_RSI;
  sparse_tree *in_RDI;
  int cur;
  Node *in_stack_fffffffffffffe78;
  Node *in_stack_fffffffffffffe80;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 *__new_size_00;
  sparse_tree *this_00;
  int n_00;
  sparse_tree *this_01;
  allocator_type local_f5;
  int in_stack_ffffffffffffff0c;
  sparse_tree *in_stack_ffffffffffffff10;
  string local_d0 [32];
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [148];
  int local_14;
  
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::vector<Node,_std::allocator<Node>_>::vector((vector<Node,_std::allocator<Node>_> *)0x11de80);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11de93);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11dea6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11deb9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11decc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11dedf);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11def5);
  std::__cxx11::string::string((string *)&in_RDI->structure);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x11df24);
  in_RDI->n = (uint16_t)local_14;
  std::__cxx11::string::operator=((string *)&in_RDI->structure,(string *)in_RSI);
  __new_size = (size_type)(local_14 + 1);
  this_01 = this_00;
  Node::Node(in_stack_fffffffffffffe80);
  std::vector<Node,_std::allocator<Node>_>::resize(&this_01->tree,__new_size,(value_type *)this_00);
  Node::~Node(in_stack_fffffffffffffe80);
  Node::Node(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  std::vector<Node,_std::allocator<Node>_>::operator[](&this_01->tree,0);
  __new_size_00 = local_a8;
  Node::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  Node::~Node(in_stack_fffffffffffffe80);
  local_ac = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,__new_size,(value_type *)this_00);
  local_b0 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,__new_size,(value_type *)this_00);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size_00);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size_00);
  std::__cxx11::string::string(local_d0,(string *)in_RSI);
  create_tree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_RSI);
  std::__cxx11::string::~string(local_d0);
  preprocess((sparse_tree *)CONCAT44(local_14,in_stack_fffffffffffffe90));
  this_01->ptr = 0;
  dfs(this_01,(int)(__new_size >> 0x20),(int)__new_size,(int)((ulong)this_00 >> 0x20));
  makeArr(this_00);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x11e114);
  std::vector<int,_std::allocator<int>_>::size(&this_01->euler);
  __a = &local_f5;
  std::allocator<int>::allocator((allocator<int> *)0x11e151);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size_00,
             (value_type *)CONCAT44(local_14,in_stack_fffffffffffffe90),__a);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_01,__new_size,(value_type *)this_00);
  n_00 = (int)(__new_size >> 0x20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(local_14,in_stack_fffffffffffffe90));
  std::allocator<int>::~allocator((allocator<int> *)0x11e1a4);
  std::vector<int,_std::allocator<int>_>::size(&this_01->euler);
  buildSparseTable(this_01,n_00);
  return;
}

Assistant:

sparse_tree::sparse_tree(std::string structure,int n){
    this->n = n;
    this->structure = structure;
    tree.resize(n+1,Node());
    tree[0] = Node(0);
    FAI.resize(2*(n+1),-1);
    level.resize((n+1),-1);
    up.resize(n+1);
    logn.resize(2*(n+1));
    create_tree(n,structure);
    preprocess();
    ptr = 0;

    int cur = 1;
    dfs(0,-1,0);
    // depthArr.resize(euler.size());
    makeArr();
    level.clear();
    sparse_table.resize(euler.size(),std::vector<int>(maxSize,-1));
    buildSparseTable(euler.size());
}